

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

float GD::average_update<true,0ul,1ul>
                (float total_weight,float normalized_sum_norm_x,float neg_norm_power)

{
  float avg_norm;
  float neg_norm_power_local;
  float normalized_sum_norm_x_local;
  float total_weight_local;
  
  return total_weight / normalized_sum_norm_x;
}

Assistant:

float average_update(float total_weight, float normalized_sum_norm_x, float neg_norm_power)
{
  if (normalized)
  {
    if (sqrt_rate)
    {
      float avg_norm = (float)(total_weight / normalized_sum_norm_x);
      if (adaptive)
        return sqrt(avg_norm);
      else
        return avg_norm;
    }
    else
      return powf((float)(normalized_sum_norm_x / total_weight), neg_norm_power);
  }
  return 1.f;
}